

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::canonical(path *p,error_code *ec)

{
  bool bVar1;
  bool bVar2;
  file_type fVar3;
  path *this;
  error_code *in_RDX;
  path *in_RDI;
  error_code eVar4;
  path target;
  file_status sls;
  path pe;
  iterator __end3;
  iterator __begin3;
  path *__range3;
  size_type rootPathLen;
  bool redo;
  file_status fs;
  path result;
  path work;
  int in_stack_fffffffffffffd48;
  uint in_stack_fffffffffffffd4c;
  iterator *in_stack_fffffffffffffd50;
  iterator *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd64;
  byte in_stack_fffffffffffffd65;
  byte in_stack_fffffffffffffd66;
  undefined1 in_stack_fffffffffffffd67;
  path *in_stack_fffffffffffffd68;
  path *this_00;
  path *lhs;
  error_code *in_stack_fffffffffffffda0;
  path *in_stack_fffffffffffffda8;
  file_status local_238 [5];
  file_status local_210 [5];
  path *in_stack_fffffffffffffe18;
  error_code *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  byte bVar5;
  path *in_stack_ffffffffffffff00;
  path *in_stack_ffffffffffffff08;
  iterator local_e8;
  path *local_a0;
  iterator *local_98;
  byte local_89;
  int local_88;
  undefined4 uStack_84;
  error_category *local_80;
  int local_74;
  file_status local_70 [5];
  path local_48;
  int local_28;
  undefined4 uStack_24;
  error_category *local_20;
  error_code *local_18;
  
  lhs = in_RDI;
  local_18 = in_RDX;
  bVar1 = path::empty((path *)0x28b099);
  if (bVar1) {
    eVar4 = detail::make_error_code((portable_error)((ulong)in_stack_fffffffffffffd50 >> 0x20));
    local_20 = eVar4._M_cat;
    local_28 = eVar4._M_value;
    *(ulong *)local_18 = CONCAT44(uStack_24,local_28);
    local_18->_M_cat = local_20;
    path::path((path *)0x28b0e1);
  }
  else {
    bVar1 = path::is_absolute((path *)0x28b0f3);
    if (bVar1) {
      path::path((path *)in_stack_fffffffffffffd50,
                 (path *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    }
    else {
      absolute((path *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
               in_stack_fffffffffffffe70);
    }
    path::path((path *)0x28b13a);
    status(in_stack_fffffffffffffd68,
           (error_code *)
           CONCAT17(in_stack_fffffffffffffd67,
                    CONCAT16(in_stack_fffffffffffffd66,
                             CONCAT15(in_stack_fffffffffffffd65,
                                      CONCAT14(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60))
                            )));
    bVar1 = std::error_code::operator_cast_to_bool(local_18);
    if (bVar1) {
      path::path((path *)0x28b174);
      local_74 = 1;
    }
    else {
      fVar3 = file_status::type(local_70);
      if (fVar3 == not_found) {
        eVar4 = detail::make_error_code((portable_error)((ulong)in_stack_fffffffffffffd50 >> 0x20));
        local_80 = eVar4._M_cat;
        local_88 = eVar4._M_value;
        *(ulong *)local_18 = CONCAT44(uStack_84,local_88);
        local_18->_M_cat = local_80;
        path::path((path *)0x28b1d8);
        local_74 = 1;
      }
      else {
        do {
          this_00 = &local_48;
          this = (path *)path::root_name_length((path *)in_stack_fffffffffffffd58);
          bVar1 = path::has_root_directory
                            ((path *)CONCAT17(in_stack_fffffffffffffd67,
                                              CONCAT16(in_stack_fffffffffffffd66,
                                                       CONCAT15(in_stack_fffffffffffffd65,
                                                                CONCAT14(in_stack_fffffffffffffd64,
                                                                         in_stack_fffffffffffffd60))
                                                      )));
          local_98 = (iterator *)(&(this->_path)._M_dataplus + bVar1);
          local_89 = 0;
          path::clear((path *)0x28b235);
          local_a0 = this_00;
          path::begin(this);
          path::end(this);
          while (bVar1 = path::iterator::operator!=
                                   (in_stack_fffffffffffffd50,
                                    (iterator *)
                                    CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)),
                bVar1) {
            path::iterator::operator*(&local_e8);
            path::path((path *)in_stack_fffffffffffffd50,
                       (path *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
            bVar2 = path::empty((path *)0x28b2f9);
            bVar5 = 0;
            bVar1 = true;
            if (!bVar2) {
              path::path<char[2],ghc::filesystem::path>
                        (this_00,(char (*) [2])this,
                         CONCAT13(1,CONCAT12(in_stack_fffffffffffffd66,
                                             CONCAT11(in_stack_fffffffffffffd65,
                                                      in_stack_fffffffffffffd64))));
              bVar5 = 1;
              bVar1 = operator==((path *)in_stack_fffffffffffffd50,
                                 (path *)CONCAT44(in_stack_fffffffffffffd4c,
                                                  in_stack_fffffffffffffd48));
            }
            in_stack_fffffffffffffd66 = bVar1;
            in_stack_fffffffffffffd67 = in_stack_fffffffffffffd66;
            if ((bVar5 & 1) != 0) {
              path::~path((path *)0x28b36b);
            }
            if ((in_stack_fffffffffffffd66 & 1) == 0) {
              path::path<char[3],ghc::filesystem::path>
                        (this_00,(char (*) [3])this,
                         CONCAT13(in_stack_fffffffffffffd67,
                                  CONCAT12(in_stack_fffffffffffffd66,
                                           CONCAT11(in_stack_fffffffffffffd65,
                                                    in_stack_fffffffffffffd64))));
              in_stack_fffffffffffffd65 =
                   operator==((path *)in_stack_fffffffffffffd50,
                              (path *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48))
              ;
              path::~path((path *)0x28b3f8);
              if ((in_stack_fffffffffffffd65 & 1) == 0) {
                operator/(lhs,this_00);
                path::string_abi_cxx11_((path *)in_stack_fffffffffffffd58);
                in_stack_fffffffffffffd58 = (iterator *)std::__cxx11::string::length();
                in_stack_fffffffffffffd50 = local_98;
                std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
                path::~path((path *)0x28b4ba);
                if (in_stack_fffffffffffffd50 < in_stack_fffffffffffffd58) {
                  operator/(lhs,this_00);
                  symlink_status((path *)in_stack_fffffffffffffd58,
                                 (error_code *)in_stack_fffffffffffffd50);
                  path::~path((path *)0x28b563);
                  bVar1 = std::error_code::operator_cast_to_bool(local_18);
                  if (bVar1) {
                    path::path((path *)0x28b580);
                    local_74 = 1;
                  }
                  else {
                    file_status::file_status(local_238,local_210);
                    bVar1 = is_symlink((file_status *)0x28b5b2);
                    in_stack_fffffffffffffd4c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd4c);
                    file_status::~file_status(local_238);
                    if ((in_stack_fffffffffffffd4c & 0x1000000) == 0) {
                      path::operator/=(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
                      local_74 = 0;
                    }
                    else {
                      local_89 = 1;
                      operator/(lhs,this_00);
                      read_symlink(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
                      path::~path((path *)0x28b617);
                      bVar1 = std::error_code::operator_cast_to_bool(local_18);
                      if (bVar1) {
                        path::path((path *)0x28b634);
                        local_74 = 1;
                      }
                      else {
                        bVar1 = path::is_absolute((path *)0x28b68a);
                        if (bVar1) {
                          path::operator=((path *)in_stack_fffffffffffffd50,
                                          (path *)CONCAT44(in_stack_fffffffffffffd4c,
                                                           in_stack_fffffffffffffd48));
                          local_74 = 5;
                        }
                        else {
                          path::operator/=(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
                          local_74 = 5;
                        }
                      }
                      path::~path((path *)0x28b6fd);
                    }
                  }
                  file_status::~file_status(local_210);
                  if (local_74 == 0) {
                    local_74 = 0;
                  }
                }
                else {
                  path::operator/=(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
                  local_74 = 5;
                }
              }
              else {
                path::parent_path(in_stack_fffffffffffffe18);
                path::operator=((path *)in_stack_fffffffffffffd50,
                                (path *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48
                                                ));
                path::~path((path *)0x28b43b);
                local_74 = 5;
              }
            }
            else {
              local_74 = 5;
            }
            path::~path((path *)0x28b755);
            in_stack_fffffffffffffd48 = local_74;
            if ((local_74 != 0) && (local_74 != 5)) goto LAB_0028b7a1;
            path::iterator::operator++
                      ((iterator *)
                       CONCAT17(in_stack_fffffffffffffd67,
                                CONCAT16(in_stack_fffffffffffffd66,
                                         CONCAT15(in_stack_fffffffffffffd65,
                                                  CONCAT14(in_stack_fffffffffffffd64,
                                                           in_stack_fffffffffffffd60)))));
          }
          local_74 = 4;
LAB_0028b7a1:
          path::iterator::~iterator((iterator *)0x28b7ae);
          path::iterator::~iterator((iterator *)0x28b7bb);
          if (local_74 != 4) goto LAB_0028b836;
          path::operator=((path *)in_stack_fffffffffffffd50,
                          (path *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        } while ((local_89 & 1) != 0);
        std::error_code::clear((error_code *)in_stack_fffffffffffffd50);
        path::path((path *)in_stack_fffffffffffffd50,
                   (path *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        local_74 = 1;
      }
    }
LAB_0028b836:
    file_status::~file_status(local_70);
    path::~path((path *)0x28b850);
    path::~path((path *)0x28b85d);
  }
  return in_RDI;
}

Assistant:

GHC_INLINE path canonical(const path& p, std::error_code& ec)
{
    if (p.empty()) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    path work = p.is_absolute() ? p : absolute(p, ec);
    path result;

    auto fs = status(work, ec);
    if (ec) {
        return path();
    }
    if (fs.type() == file_type::not_found) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    bool redo;
    do {
        auto rootPathLen = work._prefixLength + work.root_name_length() + (work.has_root_directory() ? 1 : 0);
        redo = false;
        result.clear();
        for (auto pe : work) {
            if (pe.empty() || pe == ".") {
                continue;
            }
            else if (pe == "..") {
                result = result.parent_path();
                continue;
            }
            else if ((result / pe).string().length() <= rootPathLen) {
                result /= pe;
                continue;
            }
            auto sls = symlink_status(result / pe, ec);
            if (ec) {
                return path();
            }
            if (is_symlink(sls)) {
                redo = true;
                auto target = read_symlink(result / pe, ec);
                if (ec) {
                    return path();
                }
                if (target.is_absolute()) {
                    result = target;
                    continue;
                }
                else {
                    result /= target;
                    continue;
                }
            }
            else {
                result /= pe;
            }
        }
        work = result;
    } while (redo);
    ec.clear();
    return result;
}